

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingViaL0Minimization.cpp
# Opt level: O0

void __thiscall
MeshDenoisingViaL0Minimization::solveDelta
          (MeshDenoisingViaL0Minimization *this,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *area_based_edge_operator,double lambda,double beta,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *delta)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  double dVar4;
  double dVar5;
  undefined1 local_68 [8];
  Point pt;
  undefined1 local_48 [4];
  int i;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *local_30;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *delta_local;
  double beta_local;
  double lambda_local;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *area_based_edge_operator_local;
  MeshDenoisingViaL0Minimization *this_local;
  
  local_30 = delta;
  delta_local = (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 *)beta;
  beta_local = lambda;
  lambda_local = (double)area_based_edge_operator;
  area_based_edge_operator_local =
       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)this;
  sVar2 = std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::size(area_based_edge_operator);
  OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)local_48,0.0,0.0,0.0);
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (delta,(long)(int)sVar2,(value_type *)local_48);
  pt.super_VectorDataT<double,_3>.values_[2]._4_4_ = 0;
  while( true ) {
    iVar1 = pt.super_VectorDataT<double,_3>.values_[2]._4_4_;
    sVar2 = std::
            vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
            size((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  *)lambda_local);
    if ((int)sVar2 <= iVar1) break;
    pvVar3 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)lambda_local,(long)pt.super_VectorDataT<double,_3>.values_[2]._4_4_);
    local_68 = (undefined1  [8])(pvVar3->super_VectorDataT<double,_3>).values_[0];
    pt.super_VectorDataT<double,_3>.values_[0] = (pvVar3->super_VectorDataT<double,_3>).values_[1];
    pt.super_VectorDataT<double,_3>.values_[1] = (pvVar3->super_VectorDataT<double,_3>).values_[2];
    dVar4 = OpenMesh::VectorT<double,_3>::length((VectorT<double,_3> *)local_68);
    dVar5 = OpenMesh::VectorT<double,_3>::length((VectorT<double,_3> *)local_68);
    if (beta_local / (double)delta_local <= dVar4 * dVar5) {
      pvVar3 = std::
               vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
               ::operator[](local_30,(long)pt.super_VectorDataT<double,_3>.values_[2]._4_4_);
      (pvVar3->super_VectorDataT<double,_3>).values_[0] = (double)local_68;
      (pvVar3->super_VectorDataT<double,_3>).values_[1] = pt.super_VectorDataT<double,_3>.values_[0]
      ;
      (pvVar3->super_VectorDataT<double,_3>).values_[2] = pt.super_VectorDataT<double,_3>.values_[1]
      ;
    }
    pt.super_VectorDataT<double,_3>.values_[2]._4_4_ =
         pt.super_VectorDataT<double,_3>.values_[2]._4_4_ + 1;
  }
  return;
}

Assistant:

void MeshDenoisingViaL0Minimization::solveDelta(std::vector<TriMesh::Point> &area_based_edge_operator, double lambda, double beta,
                                                std::vector<TriMesh::Point> &delta)
{
    delta.resize((int)area_based_edge_operator.size(), TriMesh::Point(0.0, 0.0, 0.0));

    for(int i = 0; i < (int)area_based_edge_operator.size(); i++)
    {
        TriMesh::Point pt = area_based_edge_operator[i];
        if(pt.length() * pt.length() >= lambda/beta)
            delta[i] = pt;
    }
}